

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int target_set_dynamic_node_properties
              (TARGET_HANDLE target,node_properties dynamic_node_properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE dynamic_node_properties_amqp_value;
  TARGET_INSTANCE *target_instance;
  int result;
  node_properties dynamic_node_properties_value_local;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance._4_4_ = 0x37cd;
  }
  else {
    item_value = amqpvalue_create_node_properties(dynamic_node_properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      target_instance._4_4_ = 0x37d5;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(target->composite_value,5,item_value);
      if (iVar1 == 0) {
        target_instance._4_4_ = 0;
      }
      else {
        target_instance._4_4_ = 0x37db;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return target_instance._4_4_;
}

Assistant:

int target_set_dynamic_node_properties(TARGET_HANDLE target, node_properties dynamic_node_properties_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        AMQP_VALUE dynamic_node_properties_amqp_value = amqpvalue_create_node_properties(dynamic_node_properties_value);
        if (dynamic_node_properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(target_instance->composite_value, 5, dynamic_node_properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(dynamic_node_properties_amqp_value);
        }
    }

    return result;
}